

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.hpp
# Opt level: O0

Path<SimpleState_*> *
xmotion::Dijkstra::Search<SimpleState*,double,SimpleStateIndexer,int>
          (Graph<SimpleState_*,_double,_SimpleStateIndexer> *graph,int start,int goal)

{
  bool bVar1;
  function<std::vector<std::tuple<SimpleState_*,_double>,_std::allocator<std::tuple<SimpleState_*,_double>_>_>_(SimpleState_*)>
  *in_RSI;
  Path<SimpleState_*> *in_RDI;
  vertex_iterator *wp;
  iterator __end0;
  iterator __begin0;
  vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  *__range3;
  GetNeighbourFunc_t<SimpleState_*,_double> *in_stack_00000080;
  Graph<SimpleState_*,_double,_SimpleStateIndexer> *in_stack_00000088;
  vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  path_vtx;
  vertex_iterator goal_it;
  vertex_iterator start_it;
  Path<SimpleState_*> *path;
  Graph<SimpleState_*,_double,_SimpleStateIndexer> *in_stack_ffffffffffffff08;
  int64_t in_stack_ffffffffffffff10;
  function<std::vector<std::tuple<SimpleState_*,_double>,_std::allocator<std::tuple<SimpleState_*,_double>_>_>_(SimpleState_*)>
  *__lhs;
  Graph<SimpleState_*,_double,_SimpleStateIndexer> *in_stack_ffffffffffffff18;
  value_type *__x;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
  in_stack_ffffffffffffff20;
  bool local_d1;
  __normal_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator_*,_std::vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>_>
  local_a8;
  undefined1 *local_a0;
  value_type local_98 [4];
  __node_type *local_78;
  __node_type *local_70;
  undefined1 local_68 [24];
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
  local_50 [3];
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
  local_38;
  undefined1 local_29;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
  local_28;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
  local_20 [2];
  function<std::vector<std::tuple<SimpleState_*,_double>,_std::allocator<std::tuple<SimpleState_*,_double>_>_>_(SimpleState_*)>
  *local_10;
  
  local_10 = in_RSI;
  Graph<SimpleState_*,_double,_SimpleStateIndexer>::ResetAllVertices
            ((Graph<SimpleState_*,_double,_SimpleStateIndexer> *)in_stack_ffffffffffffff20._M_cur);
  local_20[0]._M_cur =
       (__node_type *)
       Graph<SimpleState_*,_double,_SimpleStateIndexer>::FindVertex
                 (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  local_28._M_cur =
       (__node_type *)
       Graph<SimpleState_*,_double,_SimpleStateIndexer>::FindVertex
                 (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  local_29 = 0;
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::vector
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)0x102bbb);
  local_38._M_cur =
       (__node_type *)
       Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_end(in_stack_ffffffffffffff08);
  bVar1 = std::__detail::operator!=(local_20,&local_38);
  local_d1 = false;
  if (bVar1) {
    in_stack_ffffffffffffff20._M_cur =
         (__node_type *)
         Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_end(in_stack_ffffffffffffff08);
    local_50[0]._M_cur = in_stack_ffffffffffffff20._M_cur;
    local_d1 = std::__detail::operator!=(&local_28,local_50);
  }
  if (local_d1 != false) {
    local_70 = local_20[0]._M_cur;
    local_78 = local_28._M_cur;
    __x = local_98;
    std::
    function<std::vector<std::tuple<SimpleState_*,_double>,_std::allocator<std::tuple<SimpleState_*,_double>_>_>_(SimpleState_*)>
    ::function(local_10,in_stack_ffffffffffffff08);
    PerformSearch<SimpleState*,double,SimpleStateIndexer>
              (in_stack_00000088,
               (vertex_iterator)
               path_vtx.
               super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (vertex_iterator)
               path_vtx.
               super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
               ._M_impl.super__Vector_impl_data._M_start,in_stack_00000080);
    std::
    function<std::vector<std::tuple<SimpleState_*,_double>,_std::allocator<std::tuple<SimpleState_*,_double>_>_>_(SimpleState_*)>
    ::~function((function<std::vector<std::tuple<SimpleState_*,_double>,_std::allocator<std::tuple<SimpleState_*,_double>_>_>_(SimpleState_*)>
                 *)0x102cba);
    local_a0 = local_68;
    local_a8._M_current =
         (vertex_iterator *)
         std::
         vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
         ::begin((vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
                  *)in_stack_ffffffffffffff08);
    std::
    vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
    ::end((vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
           *)in_stack_ffffffffffffff08);
    __lhs = local_10;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator_*,_std::vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>_>
                               *)__lhs,(__normal_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator_*,_std::vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>_>
                                        *)in_stack_ffffffffffffff08), bVar1) {
      __gnu_cxx::
      __normal_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator_*,_std::vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>_>
      ::operator*(&local_a8);
      Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator::operator->
                ((vertex_iterator *)0x102d16);
      std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::push_back
                ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)
                 in_stack_ffffffffffffff20._M_cur,__x);
      __gnu_cxx::
      __normal_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator_*,_std::vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>_>
      ::operator++(&local_a8);
    }
    std::
    vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
    ::~vector((vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
               *)in_stack_ffffffffffffff20._M_cur);
  }
  return in_RDI;
}

Assistant:

static Path<State> Search(Graph<State, Transition, StateIndexer> *graph,
                            VertexIdentifier start, VertexIdentifier goal) {
    // reset last search information
    graph->ResetAllVertices();

    auto start_it = graph->FindVertex(start);
    auto goal_it = graph->FindVertex(goal);

    Path<State> path;
    // start a new search and return result
    if (start_it != graph->vertex_end() && goal_it != graph->vertex_end()) {
      auto path_vtx = PerformSearch(graph, start_it, goal_it);
      for (auto &wp : path_vtx) path.push_back(wp->state);
    }
    return path;
  }